

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prefilter.cc
# Opt level: O2

void re2::Prefilter::SimplifyStringSet(SSet *ss)

{
  _Rb_tree_header *p_Var1;
  _Base_ptr p_Var2;
  iterator __position;
  long lVar3;
  
  p_Var2 = (ss->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var1 = &(ss->_M_t)._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var2 == p_Var1) goto LAB_00121feb;
  if (p_Var2[1]._M_parent != (_Base_ptr)0x0) goto LAB_00121feb;
LAB_00121fe0:
  p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2);
LAB_00121feb:
  if ((_Rb_tree_header *)p_Var2 == p_Var1) {
    return;
  }
  __position._M_node = (_Base_ptr)std::_Rb_tree_increment(p_Var2);
LAB_00121fff:
  do {
    if ((_Rb_tree_header *)__position._M_node == p_Var1) goto LAB_00121fe0;
    if (p_Var2[1]._M_parent < __position._M_node[1]._M_parent) {
      lVar3 = std::__cxx11::string::find((string *)(__position._M_node + 1),(ulong)(p_Var2 + 1));
      if (lVar3 != -1) {
        __position = std::
                     _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,re2::Prefilter::LengthThenLex,std::allocator<std::__cxx11::string>>
                     ::erase_abi_cxx11_((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,re2::Prefilter::LengthThenLex,std::allocator<std::__cxx11::string>>
                                         *)ss,__position._M_node);
        goto LAB_00121fff;
      }
    }
    __position._M_node = (_Base_ptr)std::_Rb_tree_increment(__position._M_node);
  } while( true );
}

Assistant:

void Prefilter::SimplifyStringSet(SSet* ss) {
  // Now make sure that the strings aren't redundant.  For example, if
  // we know "ab" is a required string, then it doesn't help at all to
  // know that "abc" is also a required string, so delete "abc". This
  // is because, when we are performing a string search to filter
  // regexps, matching "ab" will already allow this regexp to be a
  // candidate for match, so further matching "abc" is redundant.
  // Note that we must ignore "" because find() would find it at the
  // start of everything and thus we would end up erasing everything.
  //
  // The SSet sorts strings by length, then lexicographically. Note that
  // smaller strings appear first and all strings must be unique. These
  // observations let us skip string comparisons when possible.
  SSIter i = ss->begin();
  if (i != ss->end() && i->empty()) {
    ++i;
  }
  for (; i != ss->end(); ++i) {
    SSIter j = i;
    ++j;
    while (j != ss->end()) {
      if (j->size() > i->size() && j->find(*i) != std::string::npos) {
        j = ss->erase(j);
        continue;
      }
      ++j;
    }
  }
}